

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

int __thiscall
glcts::CoherentBlendTestCaseGroup::init(CoherentBlendTestCaseGroup *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"mixedSequence",fixed_sample_locations_values + 1)
  ;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215b610;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0xb00000004;
  pTVar3[1].m_name._M_string_length = (size_type)s_mixed;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"multiplySequence",
             fixed_sample_locations_values + 1);
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215b610;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  *(undefined8 *)((long)&pTVar3[1].m_testCtx + 4) = 0x700000001;
  pTVar3[1].m_name._M_string_length = (size_type)s_multiply;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(
			new CoherentBlendTest(m_context, "mixedSequence", m_glslVersion, 4, DE_LENGTH_OF_ARRAY(s_mixed), s_mixed));
		addChild(new CoherentBlendTest(m_context, "multiplySequence", m_glslVersion, 1, DE_LENGTH_OF_ARRAY(s_multiply),
									   s_multiply));
	}